

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

void ncnn::compute_A_tile_int8_scales
               (Mat *A,Mat *scales,float B_scale,Mat *out_descales,int i,int max_ii)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  __m128 _absmax0;
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 auVar36 [32];
  
  auVar5 = _DAT_005f2900;
  iVar2 = A->elempack;
  if (0 < (int)((long)max_ii / (long)iVar2)) {
    iVar12 = A->w;
    uVar6 = iVar12 * iVar2;
    auVar23._0_4_ = 0.007874016 / B_scale;
    auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar23 = vshufps_avx(auVar23,auVar23,0);
    if (A->dims == 3) {
      iVar12 = (int)A->cstep;
    }
    lVar1 = (long)i * 4;
    pauVar10 = (undefined1 (*) [32])((long)out_descales->data + lVar1);
    pauVar11 = (undefined1 (*) [32])(lVar1 + (long)scales->data);
    auVar27 = ZEXT464(0x3f800000);
    uVar7 = 0;
    auVar35._8_4_ = 0x7fffffff;
    auVar35._0_8_ = 0x7fffffff7fffffff;
    auVar35._12_4_ = 0x7fffffff;
    auVar35._16_4_ = 0x7fffffff;
    auVar35._20_4_ = 0x7fffffff;
    auVar35._24_4_ = 0x7fffffff;
    auVar35._28_4_ = 0x7fffffff;
    auVar30 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar34._8_8_ = 0x8000000000000000;
    auVar34._0_8_ = 0x8000000000000000;
    auVar4 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    do {
      pauVar15 = (undefined1 (*) [32])
                 ((uVar7 * (long)iVar2 + (long)i) * (long)iVar12 * 4 + (long)A->data);
      auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar36 = ZEXT1632(ZEXT816(0) << 0x40);
      if ((int)uVar6 < 8) {
        uVar16 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar36 = vandps_avx(auVar35,*pauVar15);
          auVar36 = vmaxps_avx(auVar37._0_32_,auVar36);
          auVar37 = ZEXT3264(auVar36);
          pauVar15 = pauVar15 + 1;
          iVar8 = iVar8 + 8;
          uVar16 = uVar6 & 0xfffffff8;
        } while (iVar8 < (int)uVar6);
      }
      auVar38 = ZEXT816(0) << 0x40;
      uVar9 = uVar16 | 3;
      while ((int)uVar9 < (int)uVar6) {
        auVar17 = vandps_avx(auVar30._0_16_,*(undefined1 (*) [16])*pauVar15);
        auVar38 = vmaxps_avx(auVar38,auVar17);
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        uVar9 = uVar16 + 7;
        uVar16 = uVar16 + 4;
      }
      auVar17 = ZEXT816(0) << 0x40;
      if ((int)uVar16 < (int)uVar6) {
        uVar13 = CONCAT44(0,~uVar16 + uVar6);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar13;
        auVar33 = vpshufd_avx(auVar17,0x44);
        auVar17 = vorps_avx(auVar33,auVar34);
        auVar29 = vorps_avx(auVar33,auVar34);
        uVar14 = 0;
        auVar27 = ZEXT1664(ZEXT816(0) << 0x40);
        do {
          auVar30 = auVar27;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar14;
          auVar18 = vpshufd_avx(auVar18,0x44);
          auVar20._16_16_ = auVar18;
          auVar20._0_16_ = auVar18;
          auVar21 = vorps_avx(auVar20,auVar5);
          auVar3 = vorps_avx(auVar20,_DAT_005f2920);
          auVar18 = vorps_avx(auVar34,auVar33);
          auVar19._0_8_ = auVar3._16_8_ ^ 0x8000000000000000;
          auVar19._8_4_ = auVar3._24_4_;
          auVar19._12_4_ = auVar3._28_4_ ^ 0x80000000;
          auVar25 = vpcmpgtq_avx(auVar19,auVar18);
          auVar31._0_8_ = auVar3._0_8_ ^ 0x8000000000000000;
          auVar31._8_4_ = auVar3._8_4_;
          auVar31._12_4_ = auVar3._12_4_ ^ 0x80000000;
          auVar19 = vpcmpgtq_avx(auVar31,auVar17);
          auVar19 = vpackssdw_avx(auVar19,auVar25);
          auVar32._0_8_ = auVar21._16_8_ ^ 0x8000000000000000;
          auVar32._8_4_ = auVar21._24_4_;
          auVar32._12_4_ = auVar21._28_4_ ^ 0x80000000;
          auVar31 = vpcmpgtq_avx(auVar32,auVar18);
          auVar24._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
          auVar24._8_4_ = auVar21._8_4_;
          auVar24._12_4_ = auVar21._12_4_ ^ 0x80000000;
          auVar18 = vpcmpgtq_avx(auVar24,auVar29);
          auVar18 = vpackssdw_avx(auVar18,auVar31);
          auVar18 = vpackssdw_avx(auVar18 ^ auVar4,auVar19 ^ auVar4);
          auVar19 = vpmovsxwd_avx(auVar18);
          auVar18 = vpunpckhwd_avx(auVar18,auVar18);
          auVar26._16_16_ = auVar18;
          auVar26._0_16_ = auVar19;
          auVar20 = vmaskmovps_avx(auVar26,*(undefined1 (*) [32])(*pauVar15 + uVar14 * 4));
          auVar20 = vandps_avx(auVar35,auVar20);
          auVar20 = vmaxps_avx(auVar20,auVar30._0_32_);
          uVar14 = uVar14 + 8;
          auVar27 = ZEXT3264(auVar20);
        } while ((uVar13 + 8 & 0xfffffffffffffff8) != uVar14);
        auVar17 = vorps_avx(auVar33,auVar34);
        auVar29._0_8_ = auVar3._0_8_ ^ 0x8000000000000000;
        auVar29._8_4_ = auVar3._8_4_;
        auVar29._12_4_ = auVar3._12_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar29,auVar17);
        auVar29 = vpackssdw_avx(auVar17,auVar25);
        auVar17 = vorps_avx(auVar33,auVar34);
        auVar33._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
        auVar33._8_4_ = auVar21._8_4_;
        auVar33._12_4_ = auVar21._12_4_ ^ 0x80000000;
        auVar17 = vpcmpgtq_avx(auVar33,auVar17);
        auVar17 = vpackssdw_avx(auVar17,auVar31);
        auVar17 = vblendvps_avx(auVar30._0_16_,auVar20._0_16_,auVar17 ^ auVar4);
        auVar29 = vblendvps_avx(auVar30._16_16_,auVar20._16_16_,auVar29 ^ auVar4);
        auVar17 = vmaxps_avx(auVar17,auVar29);
        auVar29 = vshufpd_avx(auVar17,auVar17,1);
        auVar17 = vmaxps_avx(auVar17,auVar29);
        auVar29 = vmovshdup_avx(auVar17);
        auVar27 = ZEXT1664(auVar29);
        auVar17 = vmaxss_avx(auVar17,auVar29);
        auVar30 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      }
      local_68 = auVar23._0_4_;
      fStack_64 = auVar23._4_4_;
      fStack_60 = auVar23._8_4_;
      fStack_5c = auVar23._12_4_;
      if (iVar2 == 8) {
        auVar21._8_4_ = 0x42fe0000;
        auVar21._0_8_ = 0x42fe000042fe0000;
        auVar21._12_4_ = 0x42fe0000;
        auVar21._16_4_ = 0x42fe0000;
        auVar21._20_4_ = 0x42fe0000;
        auVar21._24_4_ = 0x42fe0000;
        auVar21._28_4_ = 0x42fe0000;
        auVar20 = vdivps_avx(auVar21,auVar36);
        auVar37._0_4_ = auVar36._0_4_ * local_68;
        auVar37._4_4_ = auVar36._4_4_ * fStack_64;
        auVar37._8_4_ = auVar36._8_4_ * fStack_60;
        auVar37._12_4_ = auVar36._12_4_ * fStack_5c;
        auVar37._16_4_ = auVar36._16_4_ * local_68;
        auVar37._20_4_ = auVar36._20_4_ * fStack_64;
        auVar37._28_36_ = auVar27._28_36_;
        auVar37._24_4_ = auVar36._24_4_ * fStack_60;
        auVar27 = ZEXT3264(auVar37._0_32_);
        *pauVar11 = auVar20;
        *pauVar10 = auVar37._0_32_;
        pauVar11 = pauVar11 + 1;
        pauVar10 = pauVar10 + 1;
      }
      if (iVar2 == 4) {
        auVar29 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
        auVar38 = vmaxps_avx(auVar38,auVar29);
        auVar25._8_4_ = 0x42fe0000;
        auVar25._0_8_ = 0x42fe000042fe0000;
        auVar25._12_4_ = 0x42fe0000;
        auVar29 = vdivps_avx(auVar25,auVar38);
        auVar27 = ZEXT1664(auVar29);
        auVar28._0_4_ = auVar38._0_4_ * local_68;
        auVar28._4_4_ = auVar38._4_4_ * fStack_64;
        auVar28._8_4_ = auVar38._8_4_ * fStack_60;
        auVar28._12_4_ = auVar38._12_4_ * fStack_5c;
        *(undefined1 (*) [16])*pauVar11 = auVar29;
        *(undefined1 (*) [16])*pauVar10 = auVar28;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        pauVar10 = (undefined1 (*) [32])((long)*pauVar10 + 0x10);
      }
      if (iVar2 == 1) {
        auVar29 = vmaxps_avx(auVar36._0_16_,auVar36._16_16_);
        auVar33 = vshufpd_avx(auVar29,auVar29,3);
        auVar29 = vmaxps_avx(auVar29,auVar33);
        auVar33 = vmovshdup_avx(auVar29);
        auVar29 = vmaxss_avx(auVar29,auVar33);
        auVar17 = vmaxss_avx(auVar17,auVar29);
        auVar29 = vshufpd_avx(auVar38,auVar38,3);
        auVar38 = vmaxps_avx(auVar38,auVar29);
        auVar29 = vmovshdup_avx(auVar38);
        auVar38 = vmaxss_avx(auVar38,auVar29);
        auVar38 = vmaxss_avx(auVar38,auVar17);
        fVar22 = 127.0 / auVar38._0_4_;
        auVar27 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar22));
        *(float *)*pauVar11 = fVar22;
        *(float *)*pauVar10 = auVar38._0_4_ * 0.007874016 * (1.0 / B_scale);
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
        pauVar10 = (undefined1 (*) [32])((long)*pauVar10 + 4);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != ((long)max_ii / (long)iVar2 & 0xffffffffU));
  }
  return;
}

Assistant:

static void compute_A_tile_int8_scales(const Mat& A, Mat& scales, float B_scale, Mat& out_descales, int i, int max_ii)
{
    compute_A_tile_fp32_int8_scales(A, scales, B_scale, out_descales, i, max_ii);
}